

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlReadDoc(xmlChar *cur,char *URL,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  ctxt = xmlNewParserCtxt();
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    pxVar1 = (xmlDocPtr)0x0;
  }
  else {
    xmlCtxtUseOptions(ctxt,options);
    input = xmlCtxtNewInputFromString(ctxt,URL,(char *)cur,encoding,2);
    if (input == (xmlParserInputPtr)0x0) {
      pxVar1 = (xmlDocPtr)0x0;
    }
    else {
      pxVar1 = xmlCtxtParseDocument(ctxt,input);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return pxVar1;
}

Assistant:

xmlDocPtr
xmlReadDoc(const xmlChar *cur, const char *URL, const char *encoding,
           int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc = NULL;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromString(ctxt, URL, (const char *) cur, encoding,
                                      XML_INPUT_BUF_STATIC);

    if (input != NULL)
        doc = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(doc);
}